

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
bwtil::IndexedBWT::BS
          (IndexedBWT *this,ulint W,uint length,pair<unsigned_long,_unsigned_long> interval)

{
  long lVar1;
  sbyte sVar2;
  byte bVar3;
  ulint uVar4;
  ulint uVar5;
  uint uVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  
  uVar5 = interval.second;
  uVar4 = interval.first;
  if (uVar4 == 0 && uVar5 == 0) {
    uVar5 = this->n;
  }
  if (length != 0) {
    uVar6 = 0;
    do {
      bVar3 = (byte)this->log_sigma;
      sVar2 = (bVar3 < 0x21) * (' ' - bVar3);
      bVar3 = (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(ulong)((uint)((int)(W >> ((ulong)(this->log_sigma * uVar6) & 0x3f)) << sVar2) >>
                      sVar2) + 1];
      lVar1 = *(long *)((long)(this->FIRST).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + (ulong)((uint)bVar3 * 8));
      uVar4 = rank(this,bVar3,uVar4);
      uVar4 = uVar4 + lVar1;
      lVar1 = *(long *)((long)(this->FIRST).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + (ulong)((uint)bVar3 * 8));
      uVar5 = rank(this,bVar3,uVar5);
      uVar5 = uVar5 + lVar1;
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  pVar7.second = uVar5;
  pVar7.first = uVar4;
  return pVar7;
}

Assistant:

pair<ulint, ulint> BS(ulint W, uint length,pair<ulint, ulint> interval= pair<ulint, ulint>(0,0)){

		if(interval.first==0 and interval.second==0)//if default interval
			interval.second = n;

		for(uint i=0;i<length;i++){

			auto c = remapping[digitAt(W,i)+1];//sum 1 since the BWT is built on the remapped text, where 1 is added to each digit

			interval.first = FIRST[c] + rank(c,interval.first);
			interval.second = FIRST[c] + rank(c,interval.second);

		}

		return interval;

	}